

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

char16_t * __thiscall
QUtf8::convertToUnicode(QUtf8 *this,char16_t *dst,QByteArrayView in,State *state)

{
  undefined1 auVar1 [16];
  uchar b;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  bool bVar23;
  qsizetype qVar24;
  long lVar25;
  char16_t cVar26;
  uint *puVar27;
  long lVar28;
  long lVar29;
  qptrdiff offset;
  P _b;
  uchar *puVar30;
  uchar *puVar31;
  size_t __n;
  P _a;
  char16_t *__n_00;
  long in_FS_OFFSET;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  QUtf8 *local_80;
  uchar *local_78;
  uchar *src;
  QUtf8 *local_68;
  uchar *begin;
  QUtf8 **local_58;
  uchar **local_50;
  uchar **local_48;
  undefined8 local_40;
  long local_38;
  
  puVar27 = (uint *)in.m_data;
  puVar31 = (uchar *)in.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = this;
  if (dst != (char16_t *)0x0) {
    uVar2 = *puVar27;
    cVar26 = L'�';
    if ((uVar2 & 2) != 0) {
      cVar26 = L'\0';
    }
    puVar30 = puVar31;
    if ((uVar2 & 1) == 0) {
      uVar3 = puVar27[1];
      lVar25 = *(long *)(puVar27 + 2);
      if (lVar25 != 0 || (uVar2 & 8) == 0 && (uVar3 & 1) == 0) {
        __n_00 = (char16_t *)(4 - lVar25);
        if ((long)dst <= 4 - lVar25) {
          __n_00 = dst;
        }
        local_40 = (uchar *)((ulong)local_40 & 0xffffffff00000000);
        __memcpy_chk(&local_40,puVar27 + 6,lVar25);
        memcpy((void *)((long)&local_40 + lVar25),puVar31,(size_t)__n_00);
        begin = (uchar *)((long)&local_40 + 1);
        qVar24 = QUtf8Functions::fromUtf8<QUtf8BaseTraits,char16_t*,unsigned_char_const*>
                           ((uchar)local_40,(char16_t **)&local_80,&begin,
                            (uchar *)((long)&local_40 + lVar25 + (long)__n_00));
        if (qVar24 == -2) {
          *(long *)(puVar27 + 2) = (long)__n_00 + lVar25;
          memcpy(puVar27 + 6,&local_40,(long)__n_00 + lVar25);
          this = local_80;
          goto LAB_0011f938;
        }
        if (qVar24 == -1) {
          *(long *)(puVar27 + 4) = *(long *)(puVar27 + 4) + 1;
          *(char16_t *)local_80 = cVar26;
          puVar30 = puVar31 + 1;
          local_80 = local_80 + 2;
        }
        else if (((uVar2 & 8) == 0 && (uVar3 & 1) == 0) &&
                (*(char16_t *)(local_80 + -2) == L'\xfeff')) {
          local_80 = local_80 + -2;
        }
        *(byte *)(puVar27 + 1) = (byte)puVar27[1] | 1;
        lVar28 = 0;
        if (-1 < qVar24) {
          lVar28 = qVar24 - lVar25;
        }
        puVar30 = puVar30 + lVar28;
      }
    }
    else if (((2 < (long)dst && (char)((uVar2 & 8) >> 3) == '\0') && (*puVar31 == 0xef)) &&
            (puVar31[1] == 0xbb)) {
      puVar30 = puVar31 + (ulong)(puVar31[2] == 0xbf) * 3;
    }
    puVar31 = puVar31 + (long)dst;
    src = puVar30;
    local_68 = local_80;
    while (src < puVar31) {
      lVar25 = (long)puVar31 - (long)src;
      local_78 = puVar31;
      begin = (uchar *)&src;
      local_58 = &local_68;
      local_50 = &local_78;
      local_48 = (uchar **)&local_40;
      local_40 = puVar31;
      if (0xf < lVar25) {
        lVar28 = 0x10;
        do {
          lVar29 = lVar28;
          if (lVar25 <= lVar29) {
            local_68 = local_68 + lVar25 * 2;
            auVar1 = *(undefined1 (*) [16])(puVar31 + -0x10);
            uVar4 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
            auVar6[0xd] = 0;
            auVar6._0_13_ = auVar1._0_13_;
            auVar6[0xe] = auVar1[7];
            auVar8[0xc] = auVar1[6];
            auVar8._0_12_ = auVar1._0_12_;
            auVar8._13_2_ = auVar6._13_2_;
            auVar10[0xb] = 0;
            auVar10._0_11_ = auVar1._0_11_;
            auVar10._12_3_ = auVar8._12_3_;
            auVar12[10] = auVar1[5];
            auVar12._0_10_ = auVar1._0_10_;
            auVar12._11_4_ = auVar10._11_4_;
            auVar14[9] = 0;
            auVar14._0_9_ = auVar1._0_9_;
            auVar14._10_5_ = auVar12._10_5_;
            auVar16[8] = auVar1[4];
            auVar16._0_8_ = auVar1._0_8_;
            auVar16._9_6_ = auVar14._9_6_;
            auVar18._7_8_ = 0;
            auVar18._0_7_ = auVar16._8_7_;
            auVar21._1_8_ = SUB158(auVar18 << 0x40,7);
            auVar21[0] = auVar1[3];
            auVar21._9_6_ = 0;
            auVar22._1_10_ = SUB1510(auVar21 << 0x30,5);
            auVar22[0] = auVar1[2];
            auVar22._11_4_ = 0;
            auVar35._3_12_ = SUB1512(auVar22 << 0x20,3);
            auVar35[2] = auVar1[1];
            auVar35[0] = auVar1[0];
            auVar35[1] = 0;
            auVar35[0xf] = 0;
            *(undefined1 (*) [16])(local_68 + -0x20) = auVar35;
            auVar33[1] = 0;
            auVar33[0] = auVar1[8];
            auVar33[2] = auVar1[9];
            auVar33[3] = 0;
            auVar33[4] = auVar1[10];
            auVar33[5] = 0;
            auVar33[6] = auVar1[0xb];
            auVar33[7] = 0;
            auVar33[8] = auVar1[0xc];
            auVar33[9] = 0;
            auVar33[10] = auVar1[0xd];
            auVar33[0xb] = 0;
            auVar33[0xc] = auVar1[0xe];
            auVar33[0xd] = 0;
            auVar33[0xe] = auVar1[0xf];
            auVar33[0xf] = 0;
            *(undefined1 (*) [16])(local_68 + -0x10) = auVar33;
            offset = -0x10;
            src = puVar31;
            goto LAB_0011f85e;
          }
          auVar1 = *(undefined1 (*) [16])(src + lVar29 + -0x10);
          uVar4 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
          auVar5[0xd] = 0;
          auVar5._0_13_ = auVar1._0_13_;
          auVar5[0xe] = auVar1[7];
          auVar7[0xc] = auVar1[6];
          auVar7._0_12_ = auVar1._0_12_;
          auVar7._13_2_ = auVar5._13_2_;
          auVar9[0xb] = 0;
          auVar9._0_11_ = auVar1._0_11_;
          auVar9._12_3_ = auVar7._12_3_;
          auVar11[10] = auVar1[5];
          auVar11._0_10_ = auVar1._0_10_;
          auVar11._11_4_ = auVar9._11_4_;
          auVar13[9] = 0;
          auVar13._0_9_ = auVar1._0_9_;
          auVar13._10_5_ = auVar11._10_5_;
          auVar15[8] = auVar1[4];
          auVar15._0_8_ = auVar1._0_8_;
          auVar15._9_6_ = auVar13._9_6_;
          auVar17._7_8_ = 0;
          auVar17._0_7_ = auVar15._8_7_;
          auVar19._1_8_ = SUB158(auVar17 << 0x40,7);
          auVar19[0] = auVar1[3];
          auVar19._9_6_ = 0;
          auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
          auVar20[0] = auVar1[2];
          auVar20._11_4_ = 0;
          auVar34._3_12_ = SUB1512(auVar20 << 0x20,3);
          auVar34[2] = auVar1[1];
          auVar34[0] = auVar1[0];
          auVar34[1] = 0;
          auVar34[0xf] = 0;
          *(undefined1 (*) [16])(local_68 + lVar29 * 2 + -0x20) = auVar34;
          auVar32[1] = 0;
          auVar32[0] = auVar1[8];
          auVar32[2] = auVar1[9];
          auVar32[3] = 0;
          auVar32[4] = auVar1[10];
          auVar32[5] = 0;
          auVar32[6] = auVar1[0xb];
          auVar32[7] = 0;
          auVar32[8] = auVar1[0xc];
          auVar32[9] = 0;
          auVar32[10] = auVar1[0xd];
          auVar32[0xb] = 0;
          auVar32[0xc] = auVar1[0xe];
          auVar32[0xd] = 0;
          auVar32[0xe] = auVar1[0xf];
          auVar32[0xf] = 0;
          *(undefined1 (*) [16])(local_68 + lVar29 * 2 + -0x10) = auVar32;
          lVar28 = lVar29 + 0x10;
        } while (uVar4 == 0);
        offset = lVar29 + -0x10;
LAB_0011f85e:
        bVar23 = simdDecodeAscii<1UL>::anon_class_32_4_99005a4f::operator()
                           ((anon_class_32_4_99005a4f *)&begin,(uint)uVar4,offset);
        if (bVar23) break;
      }
      do {
        b = *src;
        src = src + 1;
        qVar24 = QUtf8Functions::fromUtf8<QUtf8BaseTraits,char16_t*,unsigned_char_const*>
                           (b,(char16_t **)&local_68,&src,puVar31);
        if ((qVar24 < 0) && (lVar25 = qVar24 << 0x20, puVar30 = src, lVar25 != 0)) {
          if (lVar25 != -0x100000000) {
            bVar23 = lVar25 == -0x200000000;
            goto LAB_0011f8dc;
          }
          *(long *)(puVar27 + 4) = *(long *)(puVar27 + 4) + 1;
          *(char16_t *)local_68 = cVar26;
          local_68 = local_68 + 2;
        }
      } while (src < local_78);
    }
    bVar23 = false;
LAB_0011f8dc:
    this = local_68;
    local_80 = local_68;
    if (bVar23) {
      if ((*puVar27 & 1) == 0) {
        __n = (long)puVar31 - (long)(puVar30 + -1);
        *(size_t *)(puVar27 + 2) = __n;
        memcpy(puVar27 + 6,puVar30 + -1,__n);
        goto LAB_0011f938;
      }
      *(char16_t *)local_68 = L'�';
      lVar25 = *(long *)(puVar27 + 4);
      while( true ) {
        this = this + 2;
        lVar25 = lVar25 + 1;
        if (puVar31 <= puVar30) break;
        puVar30 = puVar30 + 1;
        *(char16_t *)this = L'�';
      }
      *(long *)(puVar27 + 4) = lVar25;
    }
    puVar27[2] = 0;
    puVar27[3] = 0;
  }
LAB_0011f938:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (char16_t *)this;
}

Assistant:

char16_t *QUtf8::convertToUnicode(char16_t *dst, QByteArrayView in, QStringConverter::State *state)
{
    qsizetype len = in.size();

    Q_ASSERT(state);
    if (!len)
        return dst;


    char16_t replacement = QChar::ReplacementCharacter;
    if (state->flags & QStringConverter::Flag::ConvertInvalidToNull)
        replacement = QChar::Null;

    qsizetype res;

    const uchar *src = reinterpret_cast<const uchar *>(in.data());
    const uchar *end = src + len;

    if (!(state->flags & QStringConverter::Flag::Stateless)) {
        bool headerdone = state->internalState & HeaderDone || state->flags & QStringConverter::Flag::ConvertInitialBom;
        if (state->remainingChars || !headerdone) {
            // handle incoming state first
            uchar remainingCharsData[4]; // longest UTF-8 sequence possible
            qsizetype remainingCharsCount = state->remainingChars;
            qsizetype newCharsToCopy = qMin<qsizetype>(sizeof(remainingCharsData) - remainingCharsCount, end - src);

            memset(remainingCharsData, 0, sizeof(remainingCharsData));
            memcpy(remainingCharsData, &state->state_data[0], remainingCharsCount);
            memcpy(remainingCharsData + remainingCharsCount, src, newCharsToCopy);

            const uchar *begin = &remainingCharsData[1];
            res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(remainingCharsData[0], dst, begin,
                    static_cast<const uchar *>(remainingCharsData) + remainingCharsCount + newCharsToCopy);
            if (res == QUtf8BaseTraits::Error) {
                ++state->invalidChars;
                *dst++ = replacement;
                ++src;
            } else if (res == QUtf8BaseTraits::EndOfString) {
                // if we got EndOfString again, then there were too few bytes in src;
                // copy to our state and return
                state->remainingChars = remainingCharsCount + newCharsToCopy;
                memcpy(&state->state_data[0], remainingCharsData, state->remainingChars);
                return dst;
            } else if (!headerdone) {
                // eat the UTF-8 BOM
                if (dst[-1] == 0xfeff)
                    --dst;
            }
            state->internalState |= HeaderDone;

            // adjust src now that we have maybe consumed a few chars
            if (res >= 0) {
                Q_ASSERT(res > remainingCharsCount);
                src += res - remainingCharsCount;
            }
        }
    } else if (!(state->flags & QStringConverter::Flag::ConvertInitialBom)) {
        // stateless, remove initial BOM
        if (len > 2 && src[0] == utf8bom[0] && src[1] == utf8bom[1] && src[2] == utf8bom[2])
            // skip BOM
            src += 3;
    }

    // main body, stateless decoding
    res = 0;
    dst = convertToUnicode(dst, { src, end }, [&](char16_t *&dst, const uchar *src_, int res_) {
        res = res_;
        src = src_;
        if (res == QUtf8BaseTraits::Error) {
            res = 0;
            ++state->invalidChars;
            *dst++ = replacement;
        }
        return res == 0;    // continue if plain decoding error
    });

    if (res == QUtf8BaseTraits::EndOfString) {
        // unterminated UTF sequence
        if (state->flags & QStringConverter::Flag::Stateless) {
            *dst++ = QChar::ReplacementCharacter;
            ++state->invalidChars;
            while (src++ < end) {
                *dst++ = QChar::ReplacementCharacter;
                ++state->invalidChars;
            }
            state->remainingChars = 0;
        } else {
            --src; // unread the byte in ch
            state->remainingChars = end - src;
            memcpy(&state->state_data[0], src, end - src);
        }
    } else {
        state->remainingChars = 0;
    }

    return dst;
}